

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

int get_image_bps(aom_image_t *img)

{
  aom_img_fmt_t aVar1;
  aom_image_t *img_local;
  
  aVar1 = img->fmt;
  if (aVar1 != AOM_IMG_FMT_I420) {
    if (aVar1 == AOM_IMG_FMT_I422) {
      return 0x10;
    }
    if (aVar1 == AOM_IMG_FMT_I444) {
      return 0x18;
    }
    if ((aVar1 != AOM_IMG_FMT_NV12) && (aVar1 != AOM_IMG_FMT_YV12)) {
      if (aVar1 != AOM_IMG_FMT_I42016) {
        if (aVar1 == AOM_IMG_FMT_I42216) {
          return 0x20;
        }
        if (aVar1 == AOM_IMG_FMT_I44416) {
          return 0x30;
        }
        if (aVar1 != AOM_IMG_FMT_YV1216) {
          return 0;
        }
      }
      return 0x18;
    }
  }
  return 0xc;
}

Assistant:

static int get_image_bps(const aom_image_t *img) {
  switch (img->fmt) {
    case AOM_IMG_FMT_YV12:
    case AOM_IMG_FMT_NV12:
    case AOM_IMG_FMT_I420: return 12;
    case AOM_IMG_FMT_I422: return 16;
    case AOM_IMG_FMT_I444: return 24;
    case AOM_IMG_FMT_YV1216:
    case AOM_IMG_FMT_I42016: return 24;
    case AOM_IMG_FMT_I42216: return 32;
    case AOM_IMG_FMT_I44416: return 48;
    default: assert(0 && "Invalid image format"); break;
  }
  return 0;
}